

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zreadrb.c
# Opt level: O2

void zreadrb(int *nrow,int *ncol,int_t *nonz,doublecomplex **nzval,int_t **rowind,int_t **colptr)

{
  int *piVar1;
  byte bVar2;
  char cVar3;
  doublecomplex *pdVar4;
  int_t *addr;
  double dVar5;
  FILE *__stream;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  int_t *piVar9;
  int_t *addr_00;
  int_t *piVar10;
  int_t *piVar11;
  void *addr_01;
  ulong uVar12;
  int_t *piVar13;
  int_t *piVar14;
  doublecomplex *pdVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  double *pdVar19;
  int iVar20;
  char *__s;
  int_t iVar21;
  doublecomplex *pdVar22;
  ulong uVar23;
  doublecomplex *z;
  long lVar24;
  byte *__nptr;
  int iVar25;
  bool bVar26;
  double local_220;
  int tmp;
  doublecomplex **local_1f0;
  int_t **local_1e8;
  int_t **local_1e0;
  int_t *local_1d8;
  int_t *local_1d0;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char msg [256];
  char buf [100];
  
  __stream = _stdin;
  local_1f0 = nzval;
  local_1e8 = rowind;
  local_1e0 = colptr;
  fgets(buf,100,_stdin);
  fputs(buf,_stdout);
  iVar6 = 4;
  iVar20 = 0;
  while (iVar25 = iVar6 + -1, iVar6 != 0) {
    __isoc99_fscanf(__stream,"%14c",buf);
    buf[0xe] = '\0';
    __isoc99_sscanf(buf,"%d",&tmp);
    bVar26 = iVar6 == 1;
    iVar6 = iVar25;
    if (bVar26) {
      iVar20 = tmp;
    }
  }
  zDumpLine((FILE *)__stream);
  __isoc99_fscanf(__stream,"%3c",type);
  pbVar8 = (byte *)buf;
  __isoc99_fscanf(__stream,"%11c",pbVar8);
  type[3] = '\0';
  __isoc99_fscanf(__stream,"%14c",pbVar8);
  iVar6 = atoi((char *)pbVar8);
  *nrow = iVar6;
  __isoc99_fscanf(__stream,"%14c",pbVar8);
  iVar6 = atoi((char *)pbVar8);
  *ncol = iVar6;
  __isoc99_fscanf(__stream,"%14c",pbVar8);
  iVar6 = atoi((char *)pbVar8);
  *nonz = iVar6;
  __isoc99_fscanf(__stream,"%14c",pbVar8);
  tmp = atoi((char *)pbVar8);
  if (tmp != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  zDumpLine((FILE *)__stream);
  zallocateA(*ncol,*nonz,local_1f0,local_1e8,local_1e0);
  __isoc99_fscanf(__stream,"%16c",pbVar8);
  zParseIntFormat((char *)pbVar8,&colnum,&colsize);
  __isoc99_fscanf(__stream,"%16c",pbVar8);
  zParseIntFormat((char *)pbVar8,&rownum,&rowsize);
  __isoc99_fscanf(__stream,"%20c",pbVar8);
  do {
    bVar2 = *pbVar8;
    pbVar8 = pbVar8 + 1;
  } while (bVar2 != 0x28);
  iVar6 = atoi((char *)pbVar8);
  while( true ) {
    do {
      __nptr = pbVar8 + 1;
      uVar7 = *pbVar8 - 0x44;
      pbVar8 = __nptr;
    } while (0x2c < uVar7);
    if ((0x700000007U >> ((ulong)uVar7 & 0x3f) & 1) != 0) break;
    if ((0x100000001000U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
      iVar6 = atoi((char *)__nptr);
    }
  }
  for (; (*pbVar8 != 0x29 && (*pbVar8 != 0x2e)); pbVar8 = pbVar8 + 1) {
  }
  *pbVar8 = 0;
  uVar7 = atoi((char *)__nptr);
  zDumpLine((FILE *)__stream);
  ReadVector((FILE *)__stream,*ncol + 1,*local_1e0,colnum,colsize);
  ReadVector((FILE *)__stream,*nonz,*local_1e8,rownum,rowsize);
  if (iVar20 != 0) {
    iVar21 = *nonz;
    pdVar4 = *local_1f0;
    bVar26 = false;
    uVar23 = 0;
    if (0 < (int)uVar7) {
      uVar23 = (ulong)uVar7;
    }
    piVar9 = (int_t *)(long)iVar6;
    lVar16 = (long)(int)uVar7;
    iVar20 = 0;
    local_1d0 = (int_t *)CONCAT44(local_1d0._4_4_,iVar21);
    local_1d8 = piVar9;
    while (iVar20 < iVar21) {
      __s = msg;
      fgets(__s,100,__stream);
      lVar18 = 0;
      while ((lVar18 < (long)piVar9 && (iVar20 < iVar21))) {
        lVar24 = (lVar18 + 1) * lVar16;
        cVar3 = msg[lVar24];
        msg[lVar24] = '\0';
        for (uVar17 = 0; uVar23 != uVar17; uVar17 = uVar17 + 1) {
          if ((byte)(__s[uVar17] | 0x20U) == 100) {
            __s[uVar17] = 'E';
          }
        }
        if (bVar26) {
          pdVar4[iVar20].r = local_220;
          dVar5 = atof(msg + lVar18 * lVar16);
          pdVar4[iVar20].i = dVar5;
          piVar9 = local_1d8;
          iVar21 = (int)local_1d0;
          iVar20 = iVar20 + 1;
        }
        else {
          local_220 = atof(msg + lVar18 * lVar16);
        }
        bVar26 = !bVar26;
        msg[lVar24] = cVar3;
        __s = __s + lVar16;
        lVar18 = lVar18 + 1;
      }
    }
  }
  if ((type[1] & 0xdfU) == 0x53) {
    uVar7 = *ncol;
    piVar9 = *local_1e8;
    addr = *local_1e0;
    pdVar4 = *local_1f0;
    iVar20 = uVar7 + 1;
    addr_00 = intMalloc(iVar20);
    if (addr_00 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xd2,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
      superlu_abort_and_exit(msg);
    }
    piVar10 = intMalloc(iVar20);
    if (piVar10 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xd4,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
      superlu_abort_and_exit(msg);
    }
    piVar11 = intMalloc(*nonz);
    if (piVar11 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xd6,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
      superlu_abort_and_exit(msg);
    }
    addr_01 = superlu_malloc((long)*nonz << 4);
    if (addr_01 == (void *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xd8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
      superlu_abort_and_exit(msg);
    }
    uVar23 = 0;
    uVar17 = 0;
    if (0 < (int)uVar7) {
      uVar17 = (ulong)uVar7;
    }
    for (; uVar17 != uVar23; uVar23 = uVar23 + 1) {
      addr_00[uVar23] = 0;
    }
    uVar23 = 0;
    while (uVar23 != uVar17) {
      piVar1 = addr + uVar23;
      uVar23 = uVar23 + 1;
      for (lVar16 = (long)*piVar1; lVar16 < addr[uVar23]; lVar16 = lVar16 + 1) {
        addr_00[piVar9[lVar16]] = addr_00[piVar9[lVar16]] + 1;
      }
    }
    *piVar10 = 0;
    for (uVar23 = 0; uVar17 != uVar23; uVar23 = uVar23 + 1) {
      piVar10[uVar23 + 1] = addr_00[uVar23] + piVar10[uVar23];
      addr_00[uVar23] = piVar10[uVar23];
    }
    uVar23 = 0;
    while (uVar12 = uVar23, uVar12 != uVar17) {
      lVar16 = (long)addr[uVar12];
      pdVar15 = pdVar4 + lVar16;
      for (; uVar23 = uVar12 + 1, lVar16 < addr[uVar12 + 1]; lVar16 = lVar16 + 1) {
        iVar6 = piVar9[lVar16];
        piVar11[addr_00[iVar6]] = (int_t)uVar12;
        dVar5 = pdVar15->i;
        pdVar19 = (double *)((long)addr_01 + (long)addr_00[iVar6] * 0x10);
        *pdVar19 = pdVar15->r;
        pdVar19[1] = dVar5;
        addr_00[iVar6] = addr_00[iVar6] + 1;
        pdVar15 = pdVar15 + 1;
      }
    }
    lVar16 = (long)*nonz * 2 - (long)(int)uVar7;
    piVar13 = intMalloc(iVar20);
    if (piVar13 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xf1,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
      superlu_abort_and_exit(msg);
    }
    piVar14 = intMalloc((int_t)lVar16);
    if (piVar14 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xf3,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
      superlu_abort_and_exit(msg);
    }
    pdVar15 = (doublecomplex *)superlu_malloc(lVar16 * 0x10);
    if (pdVar15 == (doublecomplex *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xf5,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zreadrb.c");
      superlu_abort_and_exit(msg);
    }
    *piVar13 = 0;
    uVar7 = 0;
    uVar23 = 0;
    local_1d8 = piVar11;
    local_1d0 = piVar10;
    while (piVar11 = local_1d0, piVar10 = local_1d8, uVar23 != uVar17) {
      lVar18 = (long)local_1d0[uVar23];
      uVar12 = uVar23 + 1;
      pdVar19 = (double *)(lVar18 * 0x10 + (long)addr_01);
      for (; lVar18 < local_1d0[uVar12]; lVar18 = lVar18 + 1) {
        if (uVar23 != (uint)local_1d8[lVar18]) {
          piVar14[(int)uVar7] = local_1d8[lVar18];
          dVar5 = pdVar19[1];
          pdVar15[(int)uVar7].r = *pdVar19;
          pdVar15[(int)uVar7].i = dVar5;
          uVar7 = uVar7 + 1;
        }
        pdVar19 = pdVar19 + 2;
      }
      lVar18 = (long)addr[uVar23];
      pdVar22 = pdVar4 + lVar18;
      piVar10 = piVar14 + (int)uVar7;
      z = pdVar15 + (int)uVar7;
      for (; lVar18 < addr[uVar12]; lVar18 = lVar18 + 1) {
        *piVar10 = piVar9[lVar18];
        dVar5 = pdVar22->i;
        z->r = pdVar22->r;
        z->i = dVar5;
        dVar5 = z_abs1(z);
        if (dVar5 < 4.047e-300) {
          printf("%5d: %e\t%e\n",SUB84(z->r,0),z->i,(ulong)uVar7);
        }
        pdVar22 = pdVar22 + 1;
        uVar7 = uVar7 + 1;
        z = z + 1;
        piVar10 = piVar10 + 1;
      }
      piVar13[uVar12] = uVar7;
      uVar23 = uVar12;
    }
    printf("FormFullA: new_nnz = %lld\n",lVar16);
    superlu_free(pdVar4);
    superlu_free(piVar9);
    superlu_free(addr);
    superlu_free(addr_00);
    superlu_free(addr_01);
    superlu_free(piVar10);
    superlu_free(piVar11);
    *local_1f0 = pdVar15;
    *local_1e8 = piVar14;
    *local_1e0 = piVar13;
    *nonz = (int_t)lVar16;
  }
  fclose(__stream);
  return;
}

Assistant:

void
zreadrb(int *nrow, int *ncol, int_t *nonz,
        doublecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    zDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    zDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    zallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    zParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    zParseFloatFormat(buf, &valnum, &valsize);
    zDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        zReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}